

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-formulas.c
# Opt level: O2

math_section * parse_formula_section(char *line,char *full_line)

{
  byte *pbVar1;
  _Bool _Var2;
  int iVar3;
  ushort **ppuVar4;
  math_section *pmVar5;
  long lVar6;
  char *line_00;
  
  ppuVar4 = __ctype_b_loc();
  line_00 = line + -1;
  do {
    pbVar1 = (byte *)(line_00 + 1);
    line_00 = line_00 + 1;
  } while ((*(byte *)((long)*ppuVar4 + (ulong)*pbVar1 * 2 + 1) & 0x20) != 0);
  _Var2 = is_all_number(line_00);
  if (_Var2) {
    pmVar5 = (math_section *)mem_alloc(8);
    lVar6 = atol(line_00);
    pmVar5->calculation_index = (int32_t)lVar6;
    pmVar5->is_calculation = false;
  }
  else {
    iVar3 = parse_calculation_line(line_00,full_line);
    if (iVar3 == -1) {
      pmVar5 = (math_section *)0x0;
    }
    else {
      pmVar5 = (math_section *)mem_alloc(8);
      pmVar5->calculation_index = iVar3;
      pmVar5->is_calculation = true;
    }
  }
  return pmVar5;
}

Assistant:

static struct math_section *parse_formula_section(
    char *line, const char *full_line)
{
    int formula = -1;

    /* skip leading whitespace */
    while (isspace((unsigned char)*line))
        line++;

    if (is_all_number(line)) {
        struct math_section *c = mem_alloc(sizeof(struct math_section));
        c->calculation_index   = atol(line);
        c->is_calculation      = false;
        return c;
    }

    /* parse the formula so it can be calculated from */
    /* the formula is stored in the "formulas" array and */
    /* the index into the array is returned */
    formula = parse_calculation_line(line, full_line);
    if (formula == -1)
        return NULL;

    struct math_section *c = mem_alloc(sizeof(struct math_section));
    c->calculation_index   = formula;
    c->is_calculation      = true;

    return c;
}